

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_peace(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *rch;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  long lVar3;
  
  for (lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + 0x18); lVar3 != 0; lVar3 = *(long *)(lVar3 + 8))
  {
    if (*(long *)(lVar3 + 0x20) != 0) {
      stop_fighting(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    if (bVar1) {
      in_stack_ffffffffffffffe0 = *(CHAR_DATA **)(lVar3 + 0x180);
      _Var2 = std::pow<int,int>(0,0x595dfa);
      if (((ulong)in_stack_ffffffffffffffe0 & (long)_Var2) != 0) {
        _Var2 = std::pow<int,int>(0,0x595e1c);
        *(ulong *)(lVar3 + 0x180) = ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(lVar3 + 0x180);
      }
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    if (bVar1) {
      *(undefined8 *)(lVar3 + 0x38) = 0;
    }
  }
  send_to_char(in_RSI,(CHAR_DATA *)0x0);
  return;
}

Assistant:

void do_peace(CHAR_DATA *ch, char *argument)
{
	for (CHAR_DATA *rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (rch->fighting != nullptr)
			stop_fighting(rch, true);

		if (is_npc(rch) && IS_SET(rch->act, ACT_AGGRESSIVE))
			REMOVE_BIT(rch->act, ACT_AGGRESSIVE);

		if (is_npc(rch))
			rch->last_fought = nullptr;
	}

	send_to_char("Ok.\n\r", ch);
}